

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

RunnerContext * SetNodeValue(Runner *runner,ASTNode *node)

{
  Token TVar1;
  ASTNode *pAVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  RunnerContext *pRVar6;
  RunnerContext *pRVar7;
  ulong uVar8;
  RunnerContext *unaff_R14;
  void *callstack [128];
  undefined1 auStack_438 [1032];
  
  if (node == (ASTNode *)0x0) {
    printf("Invalid Check: %s in %s:%d\n","node != NULL","SetNodeValue",0xaa);
    uVar4 = backtrace(auStack_438,0x80);
    unaff_R14 = (RunnerContext *)backtrace_symbols(auStack_438,uVar4);
    if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        puts((char *)(&unaff_R14->node)[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    free(unaff_R14);
  }
  lVar5 = (long)runner->totalContexts;
  if (0 < lVar5) {
    pRVar6 = runner->contexts;
    do {
      if ((pRVar6->node == (ASTNode *)0x0) || (pRVar6->node->id != node->id)) {
        bVar3 = true;
      }
      else {
        bVar3 = false;
        unaff_R14 = pRVar6;
      }
      if (!bVar3) goto LAB_00106165;
      pRVar6 = pRVar6 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  unaff_R14 = (RunnerContext *)0x0;
LAB_00106165:
  if (unaff_R14 != (RunnerContext *)0x0) {
    return unaff_R14;
  }
  pRVar6 = GetNextContext(runner);
  pRVar6->node = node;
  TVar1 = node->type;
  switch(TVar1) {
  case BOOLEAN:
    pRVar6->dataType = BOOLEAN;
    goto LAB_00106280;
  case BYTE:
    pRVar6->dataType = BYTE;
    goto LAB_00106280;
  case SHORT:
    pRVar6->dataType = SHORT;
    (pRVar6->value).vShort = (node->meta).shortExpr.value;
    break;
  case INT:
    pRVar6->dataType = INT;
    (pRVar6->value).vInt = (node->meta).intExpr.value;
    break;
  case FLOAT:
    pRVar6->dataType = FLOAT;
    (pRVar6->value).vInt = (node->meta).intExpr.value;
    break;
  case DOUBLE:
    pRVar6->dataType = DOUBLE;
    pRVar6->value = (anon_union_8_9_f6e6a019_for_value)(node->meta).doubleExpr.value;
    break;
  case LONG:
    pRVar6->dataType = LONG;
    goto LAB_0010626b;
  case END_NUMBER:
  case BEGIN_STRING:
    break;
  case CHAR:
    pRVar6->dataType = CHAR;
LAB_00106280:
    (pRVar6->value).vBoolean = (node->meta).booleanExpr.value;
    break;
  case STRING:
    pRVar6->dataType = STRING;
LAB_0010626b:
    pRVar6->value = (anon_union_8_9_f6e6a019_for_value)(node->meta).doubleExpr.value;
    break;
  default:
    if (TVar1 == VAR) {
      RunSetVarType(runner,pRVar6,node);
    }
    else if (TVar1 == FUNC_CALL) {
      pAVar2 = runner->currentNode;
      runner->currentNode = node;
      pRVar7 = RunFuncWithArgs(runner,(node->meta).binaryExpr.left,(node->meta).funcCallExpr.args);
      runner->currentNode = pAVar2;
      pRVar6->dataType = pRVar7->dataType;
      pRVar6->value = pRVar7->value;
      runner->contextUsed[(long)pRVar7->id + -1] = false;
      pRVar7->node = (ASTNode *)0x0;
      pRVar7->dataType = UNDEFINED;
    }
  }
  return pRVar6;
}

Assistant:

RunnerContext* SetNodeValue(Runner* runner, ASTNode* node){
  CHECK(node != NULL);
  RunnerContext* context = GetContextByNodeId(runner, node->id);
  if (context != NULL){
    return context;
  }

  context = GetNextContext(runner);
  context->node = node;

  int type = (int) node->type;
  switch (type) {
    case BOOLEAN: {
      context->dataType = node->type;
      context->value.vBoolean = GET_BOOLEAN_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vBoolean);
      break;
    }
    case BYTE: {
      context->dataType = BYTE;
      context->value.vByte = GET_BYTE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vByte);
      break;
    }
    case SHORT: {
      context->dataType = SHORT;
      context->value.vShort = GET_SHORT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vShort);
      break;
    }
    case INT: {
      context->dataType = INT;
      context->value.vInt = GET_INT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vInt);
      break;
    }
    case FLOAT: {
      context->dataType = FLOAT;
      context->value.vFloat = GET_FLOAT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vFloat);
      break;
    }
    case DOUBLE: {
      context->dataType = DOUBLE;
      context->value.vDouble = GET_DOUBLE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vDouble);
      break;
    }
    case LONG: {
      context->dataType = LONG;
      context->value.vLong = GET_LONG_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %ld\n", context->value.vLong);
      break;
    }
    case CHAR: {
      context->dataType = CHAR;
      context->value.vChar = GET_CHAR_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %c\n", context->value.vChar);
      break;
    }
    case STRING: {
      context->dataType = STRING;
      context->value.vString = GET_STRING_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %s\n", context->value.vString);
      break;
    }
    case VAR: {
      RunSetVarType(runner, context, node);
      break;
    }
    case FUNC_CALL: {
      ASTNode* previousNode = runner->currentNode;
      runner->currentNode = node;
      RunnerContext* newContext = RunFuncCall(runner);
      runner->currentNode = previousNode;
      MergeContextValues(newContext, context);
      GCContext(runner, newContext);
      break;
    }
  }

  return context;
}